

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void getDWTRecCoeff(double *coeff,int *length,char *ctype,char *ext,int level,int J,double *lpr,
                   double *hpr,int lf,int siglength,double *reccoeff)

{
  double dVar1;
  int iVar2;
  undefined8 *__ptr;
  uint *puVar3;
  void *__ptr_00;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  undefined8 *puVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  
  __ptr = (undefined8 *)malloc((long)siglength * 8 + 8);
  iVar17 = (int)((long)lf / 2);
  iVar2 = strcmp(ext,"per");
  if (iVar2 == 0) {
    iVar2 = strcmp(ctype,"appx");
    puVar3 = (uint *)(length + (long)(J - level) + 1);
    if (iVar2 == 0) {
      puVar3 = (uint *)length;
    }
    uVar15 = *puVar3;
    __ptr_00 = malloc((long)((length[J] + lf) * 2) * 8 - 8);
    uVar4 = 0;
    uVar6 = 0;
    if (0 < (int)uVar15) {
      uVar6 = (ulong)uVar15;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      __ptr[uVar4] = coeff[uVar4];
    }
    uVar4 = 0;
    if (0 < iVar17) {
      uVar4 = (long)lf / 2 & 0xffffffff;
    }
    for (lVar16 = (long)level; 0 < lVar16; lVar16 = lVar16 + -1) {
      iVar2 = strcmp(ctype,"det");
      pdVar5 = lpr;
      if (iVar2 == 0) {
        pdVar5 = hpr;
      }
      if (lVar16 != level) {
        pdVar5 = lpr;
      }
      uVar9 = iVar17 + -1 + uVar15;
      lVar10 = (long)(int)uVar15;
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      lVar11 = -1;
      lVar14 = -2;
      for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
        *(undefined8 *)((long)__ptr_00 + lVar14 * 8 + 0x10) = 0;
        *(undefined8 *)((long)__ptr_00 + lVar11 * 8 + 0x10) = 0;
        lVar14 = lVar14 + 2;
        lVar11 = lVar11 + 2;
        dVar19 = 0.0;
        dVar20 = 0.0;
        lVar7 = 0;
        uVar12 = uVar6;
        for (lVar18 = 0; uVar4 * 0x10 != lVar18; lVar18 = lVar18 + 0x10) {
          if (((long)uVar12 < 0) || (uVar13 = uVar12, lVar10 <= (long)uVar12)) {
            if ((long)uVar12 < (long)(int)(lf + -1 + uVar15) && lVar10 <= (long)uVar12) {
              uVar13 = (uVar6 - lVar7) - lVar10;
              goto LAB_00103870;
            }
            if (((long)uVar12 < 0) && ((long)-iVar17 < (long)uVar12)) {
              uVar13 = (ulong)(int)(uVar15 + (int)uVar12);
              goto LAB_00103870;
            }
          }
          else {
LAB_00103870:
            dVar1 = (double)__ptr[uVar13];
            dVar20 = dVar20 + *(double *)((long)pdVar5 + lVar18) * dVar1;
            *(double *)((long)__ptr_00 + lVar14 * 8) = dVar20;
            dVar19 = dVar19 + dVar1 * *(double *)((long)pdVar5 + lVar18 + 8);
            *(double *)((long)__ptr_00 + lVar11 * 8) = dVar19;
          }
          lVar7 = lVar7 + 1;
          uVar12 = uVar12 - 1;
        }
      }
      puVar8 = __ptr;
      for (lVar10 = (long)iVar17 + -1; lVar10 < (int)(iVar17 + -1 + uVar15 * 2); lVar10 = lVar10 + 1
          ) {
        *puVar8 = *(undefined8 *)((long)__ptr_00 + lVar10 * 8);
        puVar8 = puVar8 + 1;
      }
      if (lVar16 != 1) {
        uVar15 = length[(J - lVar16) + 2];
      }
    }
  }
  else {
    iVar2 = strcmp(ext,"sym");
    if (iVar2 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    iVar2 = strcmp(ctype,"appx");
    puVar3 = (uint *)(length + (long)(J - level) + 1);
    if (iVar2 == 0) {
      puVar3 = (uint *)length;
    }
    uVar15 = *puVar3;
    __ptr_00 = malloc((long)((length[J] + lf) * 2 + -2) << 3);
    uVar4 = 0;
    uVar6 = 0;
    if (0 < (int)uVar15) {
      uVar6 = (ulong)uVar15;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      __ptr[uVar4] = coeff[uVar4];
    }
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    for (lVar16 = (long)level; 0 < lVar16; lVar16 = lVar16 + -1) {
      iVar2 = strcmp(ctype,"det");
      pdVar5 = lpr;
      if (iVar2 == 0) {
        pdVar5 = hpr;
      }
      if (lVar16 != level) {
        pdVar5 = lpr;
      }
      uVar4 = 0;
      if (0 < (int)uVar15) {
        uVar4 = (ulong)uVar15;
      }
      lVar10 = -1;
      lVar11 = -2;
      for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
        *(undefined8 *)((long)__ptr_00 + lVar11 * 8 + 0x10) = 0;
        lVar11 = lVar11 + 2;
        *(undefined8 *)((long)__ptr_00 + lVar10 * 8 + 0x10) = 0;
        lVar10 = lVar10 + 2;
        dVar19 = 0.0;
        dVar20 = 0.0;
        uVar12 = uVar6;
        for (uVar13 = 0; (uint)(iVar17 * 2) != uVar13; uVar13 = uVar13 + 2) {
          if ((-1 < (long)uVar12) && ((long)uVar12 < (long)(int)uVar15)) {
            dVar1 = (double)__ptr[uVar12];
            dVar20 = dVar20 + pdVar5[uVar13] * dVar1;
            *(double *)((long)__ptr_00 + lVar11 * 8) = dVar20;
            dVar19 = dVar19 + dVar1 * pdVar5[uVar13 + 1];
            *(double *)((long)__ptr_00 + lVar10 * 8) = dVar19;
          }
          uVar12 = uVar12 - 1;
        }
      }
      for (lVar10 = (long)(lf + -2); lVar10 < (int)(uVar15 * 2); lVar10 = lVar10 + 1) {
        __ptr[(lVar10 + 2) - (long)lf] = *(undefined8 *)((long)__ptr_00 + lVar10 * 8);
      }
      if (lVar16 != 1) {
        uVar15 = length[(J - lVar16) + 2];
      }
    }
  }
  free(__ptr_00);
  uVar6 = 0;
  uVar4 = (ulong)(uint)siglength;
  if (siglength < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    reccoeff[uVar6] = (double)__ptr[uVar6];
  }
  free(__ptr);
  return;
}

Assistant:

static void getDWTRecCoeff(double *coeff, int *length, const char *ctype, const char *ext, int level, int J, double *lpr,
	double *hpr, int lf, int siglength, double *reccoeff) {

	int i, j, k, det_len, N, l, m, n, v, t, l2;
	double *out, *X_lp, *filt;
	out = (double*)malloc(sizeof(double)* (siglength + 1));
	l2 = lf / 2;
	m = -2;
	n = -1;
	if (!strcmp(ext, "per")) {
		if (!strcmp((ctype), "appx")) {
			det_len = length[0];
		}
		else {
			det_len = length[J - level + 1];
		}

		N = 2 * length[J];

		X_lp = (double*)malloc(sizeof(double)* (N + 2 * lf - 1));

		for (i = 0; i < det_len; ++i) {
			out[i] = coeff[i];
		}

		for (j = level; j > 0; --j) {

			if (!strcmp((ctype), "det") && j == level) {
				filt = hpr;
			}
			else {
				filt = lpr;
			}

			m = -2;
			n = -1;

			for (i = 0; i < det_len + l2 - 1; ++i) {
				m += 2;
				n += 2;
				X_lp[m] = 0.0;
				X_lp[n] = 0.0;
				for (l = 0; l < l2; ++l) {
					t = 2 * l;
					if ((i - l) >= 0 && (i - l) < det_len) {
						X_lp[m] += filt[t] * out[i - l];
						X_lp[n] += filt[t + 1] * out[i - l];
					}
					else if ((i - l) >= det_len && (i - l) < det_len + lf - 1) {
						X_lp[m] += filt[t] * out[i - l - det_len];
						X_lp[n] += filt[t + 1] * out[i - l - det_len];
					}
					else if ((i - l) < 0 && (i - l) > -l2) {
						X_lp[m] += filt[t] * out[det_len + i - l];
						X_lp[n] += filt[t + 1] * out[det_len + i - l];
					}
				}
			}

			for (k = lf / 2 - 1; k < 2 * det_len + lf / 2 - 1; ++k) {
				out[k - lf / 2 + 1] = X_lp[k];
			}

			if (j != 1) {
				det_len = length[J - j + 2];
			}
		}

		free(X_lp);

	}
	else if (!strcmp(ext, "sym")) {
		if (!strcmp((ctype), "appx")) {
			det_len = length[0];
		}
		else {
			det_len = length[J - level + 1];
		}

		N = 2 * length[J] - 1;

		X_lp = (double*)malloc(sizeof(double)* (N + 2 * lf - 1));

		for (i = 0; i < det_len; ++i) {
			out[i] = coeff[i];
		}

		for (j = level; j > 0; --j) {

			if (!strcmp((ctype), "det") && j == level) {
				filt = hpr;
			}
			else {
				filt = lpr;
			}

			m = -2;
			n = -1;

			for (v = 0; v < det_len; ++v) {
				i = v;
				m += 2;
				n += 2;
				X_lp[m] = 0.0;
				X_lp[n] = 0.0;
				for (l = 0; l < lf / 2; ++l) {
					t = 2 * l;
					if ((i - l) >= 0 && (i - l) < det_len) {
						X_lp[m] += filt[t] * out[i - l];
						X_lp[n] += filt[t + 1] * out[i - l];
					}
				}
			}

			for (k = lf - 2; k < 2 * det_len; ++k) {
				out[k - lf + 2] = X_lp[k];
			}


			if (j != 1) {
				det_len = length[J - j + 2];
			}
		}

		free(X_lp);

	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	for (i = 0; i < siglength; ++i) {
		reccoeff[i] = out[i];
	}

	free(out);

}